

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

bool __thiscall
QIconModeViewBase::filterStartDrag(QIconModeViewBase *this,DropActions supportedActions)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  Int IVar3;
  int iVar4;
  int iVar5;
  qsizetype qVar6;
  QModelIndex *pQVar7;
  QPoint *p2;
  QWidget *pQVar8;
  QWidget *pQVar9;
  DropAction in_ESI;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  DropAction action;
  QDrag *drag;
  QPixmap pixmap;
  QRect rect;
  ConstIterator it;
  QModelIndexList indexes;
  parameter_type in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined8 in_stack_ffffffffffffff28;
  QRect *in_stack_ffffffffffffff30;
  QPoint *p1;
  QAbstractItemViewPrivate *in_stack_ffffffffffffff48;
  QRect *in_stack_ffffffffffffff70;
  QPoint *pQVar10;
  QPoint *pQVar11;
  const_iterator in_stack_ffffffffffffff78;
  QAbstractItemViewPrivate *this_00;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined4 local_38;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_34;
  const_iterator local_30;
  QList<QModelIndex> local_28;
  DropAction local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  local_c = in_ESI;
  QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x884c3f);
  QItemSelectionModel::selectedIndexes();
  qVar6 = QList<QModelIndex>::size(&local_28);
  if (qVar6 < 1) goto LAB_00884ffd;
  QCommonListViewBase::viewport((QCommonListViewBase *)in_RDI);
  bVar2 = QWidget::acceptDrops((QWidget *)0x884c78);
  if (bVar2) {
    local_30.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_30 = QList<QModelIndex>::constBegin
                         ((QList<QModelIndex> *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    while( true ) {
      in_stack_ffffffffffffff78 =
           QList<QModelIndex>::constEnd
                     ((QList<QModelIndex> *)
                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      bVar2 = QList<QModelIndex>::const_iterator::operator!=(&local_30,in_stack_ffffffffffffff78);
      if (!bVar2) break;
      pQVar1 = ((*(QListViewPrivate **)
                  &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                   super_QWidgetPrivate.field_0x8)->super_QAbstractItemViewPrivate).model;
      pQVar7 = QList<QModelIndex>::const_iterator::operator*(&local_30);
      local_38 = (**(code **)(*(long *)pQVar1 + 0x138))(pQVar1,pQVar7);
      local_34.super_QFlagsStorage<Qt::ItemFlag>.i =
           (QFlagsStorage<Qt::ItemFlag>)
           QFlags<Qt::ItemFlag>::operator&
                     ((QFlags<Qt::ItemFlag> *)
                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      (ItemFlag)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_34);
      bVar2 = false;
      if (IVar3 != 0) {
        pQVar7 = QList<QModelIndex>::const_iterator::operator*(&local_30);
        iVar4 = QModelIndex::column(pQVar7);
        bVar2 = iVar4 == (*(QListViewPrivate **)
                           &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                            super_QWidgetPrivate.field_0x8)->column;
      }
      if (bVar2) {
        in_stack_ffffffffffffff48 =
             (QAbstractItemViewPrivate *)
             &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              focus_child;
        QList<QModelIndex>::const_iterator::operator*(&local_30);
        QList<QModelIndex>::push_back
                  ((QList<QModelIndex> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff18);
      }
      QList<QModelIndex>::const_iterator::operator++(&local_30);
    }
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemViewPrivate::renderToPixmap
            (this_00,(QModelIndexList *)in_stack_ffffffffffffff78.i,in_stack_ffffffffffffff70);
  iVar4 = (*(*(_func_int ***)
              &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate)
            [0xd])();
  (*(*(_func_int ***)
      &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate)[0xe])();
  QRect::adjust(in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                (int)in_stack_ffffffffffffff28,iVar4,in_stack_ffffffffffffff20);
  p2 = (QPoint *)operator_new(0x10);
  QDrag::QDrag((QDrag *)p2,
               *(QObject **)
                &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
                 .field_0x10);
  pQVar1 = ((*(QListViewPrivate **)
              &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
               field_0x8)->super_QAbstractItemViewPrivate).model;
  p1 = p2;
  pQVar10 = p2;
  (**(code **)(*(long *)pQVar1 + 0xd0))(pQVar1,&local_28);
  QDrag::setMimeData((QMimeData *)p1);
  QDrag::setPixmap((QPixmap *)pQVar10);
  pQVar11 = pQVar10;
  QRect::topLeft((QRect *)in_stack_ffffffffffffff18);
  ::operator-(p1,p2);
  QDrag::setHotSpot((QPoint *)pQVar10);
  ((*(QListViewPrivate **)
     &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.field_0x8)
  ->super_QAbstractItemViewPrivate).dropEventMoved = false;
  iVar5 = QDrag::exec((QFlags_conflict1 *)pQVar11,local_c);
  QList<QModelIndex>::clear((QList<QModelIndex> *)CONCAT44(iVar4,in_stack_ffffffffffffff20));
  if ((iVar5 == 2) &&
     ((((*(QListViewPrivate **)
          &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
           field_0x8)->super_QAbstractItemViewPrivate).dropEventMoved & 1U) == 0)) {
    if (((*(QListViewPrivate **)
           &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
            field_0x8)->super_QAbstractItemViewPrivate).dragDropMode == InternalMove) {
      pQVar8 = (QWidget *)QDrag::target();
      pQVar9 = QAbstractScrollArea::viewport
                         ((QAbstractScrollArea *)CONCAT44(iVar4,in_stack_ffffffffffffff20));
      if (pQVar8 != pQVar9) goto LAB_00884fe0;
    }
    QAbstractItemViewPrivate::clearOrRemove(in_stack_ffffffffffffff48);
  }
LAB_00884fe0:
  ((*(QListViewPrivate **)
     &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.field_0x8)
  ->super_QAbstractItemViewPrivate).dropEventMoved = false;
  QPixmap::~QPixmap((QPixmap *)&local_60);
LAB_00884ffd:
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x88500a);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return true;
}

Assistant:

bool QIconModeViewBase::filterStartDrag(Qt::DropActions supportedActions)
{
    // This function does the same thing as in QAbstractItemView::startDrag(),
    // plus adding viewitems to the draggedItems list.
    // We need these items to draw the drag items
    QModelIndexList indexes = dd->selectionModel->selectedIndexes();
    if (indexes.size() > 0 ) {
        if (viewport()->acceptDrops()) {
            QModelIndexList::ConstIterator it = indexes.constBegin();
            for (; it != indexes.constEnd(); ++it)
                if (dd->model->flags(*it) & Qt::ItemIsDragEnabled
                    && (*it).column() == dd->column)
                    draggedItems.push_back(*it);
        }

        QRect rect;
        QPixmap pixmap = dd->renderToPixmap(indexes, &rect);
        rect.adjust(horizontalOffset(), verticalOffset(), 0, 0);
        QDrag *drag = new QDrag(qq);
        drag->setMimeData(dd->model->mimeData(indexes));
        drag->setPixmap(pixmap);
        drag->setHotSpot(dd->pressedPosition - rect.topLeft());
        dd->dropEventMoved = false;
        Qt::DropAction action = drag->exec(supportedActions, dd->defaultDropAction);
        draggedItems.clear();
        // delete item, unless it has already been moved internally (see filterDropEvent)
        if (action == Qt::MoveAction && !dd->dropEventMoved) {
            if (dd->dragDropMode != QAbstractItemView::InternalMove || drag->target() == qq->viewport())
                dd->clearOrRemove();
        }
        dd->dropEventMoved = false;
    }
    return true;
}